

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitLoop(ParseNodeStmt *loopNode,ParseNode *cond,ParseNode *body,ParseNode *incr,
             ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,BOOL fReturnValue,BOOL doWhile,
             ParseNodeBlock *forLoopBlock)

{
  bool bVar1;
  ByteCodeLabel loopEntrance_00;
  ByteCodeLabel falseLabel;
  uint loopId_00;
  ByteCodeLabel trueLabel_00;
  ByteCodeWriter *pBVar2;
  ParseNodeInt *pPVar3;
  ByteCodeLabel trueLabel;
  uint loopId;
  ByteCodeLabel continuePastLoop;
  ByteCodeLabel loopEntrance;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *incr_local;
  ParseNode *body_local;
  ParseNode *cond_local;
  ParseNodeStmt *loopNode_local;
  
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  loopEntrance_00 = Js::ByteCodeWriter::DefineLabel(pBVar2);
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  falseLabel = Js::ByteCodeWriter::DefineLabel(pBVar2);
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  loopId_00 = Js::ByteCodeWriter::EnterLoop(pBVar2,loopEntrance_00);
  ByteCodeGenerator::PushJumpCleanupForLoop(byteCodeGenerator,&loopNode->super_ParseNode,loopId_00);
  if (doWhile == 0) {
    if (cond != (ParseNode *)0x0) {
      if ((cond->nop != knopInt) || (pPVar3 = ParseNode::AsParseNodeInt(cond), pPVar3->lw == 0)) {
        pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
        trueLabel_00 = Js::ByteCodeWriter::DefineLabel(pBVar2);
        EmitBooleanExpression(cond,trueLabel_00,falseLabel,byteCodeGenerator,funcInfo,true,false);
        pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
        Js::ByteCodeWriter::MarkLabel(pBVar2,trueLabel_00);
      }
      FuncInfo::ReleaseLoc(funcInfo,cond);
    }
    Emit(body,byteCodeGenerator,funcInfo,fReturnValue,false,false);
    FuncInfo::ReleaseLoc(funcInfo,body);
    if (forLoopBlock != (ParseNodeBlock *)0x0) {
      CloneEmitBlock(forLoopBlock,byteCodeGenerator,funcInfo);
    }
    if ((loopNode->emitLabels & 1U) != 0) {
      pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::MarkLabel(pBVar2,loopNode->continueLabel);
    }
    if (incr != (ParseNode *)0x0) {
      Emit(incr,byteCodeGenerator,funcInfo,0,false,false);
      FuncInfo::ReleaseLoc(funcInfo,incr);
    }
    pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Br(pBVar2,loopEntrance_00);
  }
  else {
    Emit(body,byteCodeGenerator,funcInfo,fReturnValue,false,false);
    FuncInfo::ReleaseLoc(funcInfo,body);
    if ((loopNode->emitLabels & 1U) != 0) {
      pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::MarkLabel(pBVar2,loopNode->continueLabel);
    }
    bVar1 = ByteCodeGenerator::IsFalse(cond);
    if ((!bVar1) || (bVar1 = ByteCodeGenerator::IsInDebugMode(byteCodeGenerator), bVar1)) {
      EmitBooleanExpression(cond,loopEntrance_00,falseLabel,byteCodeGenerator,funcInfo,false,false);
    }
    FuncInfo::ReleaseLoc(funcInfo,cond);
  }
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::MarkLabel(pBVar2,falseLabel);
  if ((loopNode->emitLabels & 1U) != 0) {
    pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::MarkLabel(pBVar2,loopNode->breakLabel);
  }
  ByteCodeGenerator::PopJumpCleanup(byteCodeGenerator);
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::ExitLoop(pBVar2,loopId_00);
  return;
}

Assistant:

void EmitLoop(
    ParseNodeStmt *loopNode,
    ParseNode *cond,
    ParseNode *body,
    ParseNode *incr,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    BOOL fReturnValue,
    BOOL doWhile = FALSE,
    ParseNodeBlock *forLoopBlock = nullptr)
{
    // Need to increment loop count whether we are going to profile or not for HasLoop()

    Js::ByteCodeLabel loopEntrance = byteCodeGenerator->Writer()->DefineLabel();
    Js::ByteCodeLabel continuePastLoop = byteCodeGenerator->Writer()->DefineLabel();

    uint loopId = byteCodeGenerator->Writer()->EnterLoop(loopEntrance);
    byteCodeGenerator->PushJumpCleanupForLoop(loopNode, loopId);

    if (doWhile)
    {
        Emit(body, byteCodeGenerator, funcInfo, fReturnValue);
        funcInfo->ReleaseLoc(body);
        if (loopNode->emitLabels)
        {
            byteCodeGenerator->Writer()->MarkLabel(loopNode->continueLabel);
        }
        if (!ByteCodeGenerator::IsFalse(cond) ||
            byteCodeGenerator->IsInDebugMode())
        {
            EmitBooleanExpression(cond, loopEntrance, continuePastLoop, byteCodeGenerator, funcInfo, false, false);
        }
        funcInfo->ReleaseLoc(cond);
    }
    else
    {
        if (cond)
        {
            if (!(cond->nop == knopInt &&
                cond->AsParseNodeInt()->lw != 0))
            {
                Js::ByteCodeLabel trueLabel = byteCodeGenerator->Writer()->DefineLabel();
                EmitBooleanExpression(cond, trueLabel, continuePastLoop, byteCodeGenerator, funcInfo, true, false);
                byteCodeGenerator->Writer()->MarkLabel(trueLabel);
            }
            funcInfo->ReleaseLoc(cond);
        }
        Emit(body, byteCodeGenerator, funcInfo, fReturnValue);
        funcInfo->ReleaseLoc(body);

        if (forLoopBlock != nullptr)
        {
            CloneEmitBlock(forLoopBlock, byteCodeGenerator, funcInfo);
        }

        if (loopNode->emitLabels)
        {
            byteCodeGenerator->Writer()->MarkLabel(loopNode->continueLabel);
        }

        if (incr != nullptr)
        {
            Emit(incr, byteCodeGenerator, funcInfo, false);
            funcInfo->ReleaseLoc(incr);
        }

        byteCodeGenerator->Writer()->Br(loopEntrance);
    }

    byteCodeGenerator->Writer()->MarkLabel(continuePastLoop);
    if (loopNode->emitLabels)
    {
        byteCodeGenerator->Writer()->MarkLabel(loopNode->breakLabel);
    }

    byteCodeGenerator->PopJumpCleanup();
    byteCodeGenerator->Writer()->ExitLoop(loopId);
}